

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O1

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  Mat max;
  Mat sum;
  void *local_100;
  Mat local_f8;
  Mat local_a8;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar1 = bottom_top_blob->dims;
  if (uVar1 == 1) {
    iVar12 = bottom_top_blob->w;
    lVar21 = (long)iVar12;
    pvVar15 = bottom_top_blob->data;
    fVar24 = -3.4028235e+38;
    if (0 < lVar21) {
      lVar9 = 0;
      do {
        fVar27 = *(float *)((long)pvVar15 + lVar9 * 4);
        if (fVar24 <= fVar27) {
          fVar24 = fVar27;
        }
        lVar9 = lVar9 + 1;
      } while (lVar21 != lVar9);
    }
    fVar27 = 0.0;
    if (0 < iVar12) {
      lVar9 = 0;
      do {
        fVar23 = expf(*(float *)((long)pvVar15 + lVar9 * 4) - fVar24);
        *(float *)((long)pvVar15 + lVar9 * 4) = fVar23;
        fVar27 = fVar27 + fVar23;
        lVar9 = lVar9 + 1;
      } while (lVar21 != lVar9);
    }
    if (0 < iVar12) {
      lVar9 = 0;
      do {
        *(float *)((long)pvVar15 + lVar9 * 4) =
             *(float *)((long)pvVar15 + lVar9 * 4) * (1.0 / fVar27);
        lVar9 = lVar9 + 1;
      } while (lVar21 != lVar9);
      return 0;
    }
LAB_0021b127:
    iVar19 = 0;
  }
  else {
    sVar2 = bottom_top_blob->elemsize;
    iVar12 = (this->axis >> 0x1f & uVar1) + this->axis;
    if ((uVar1 == 2) && (iVar12 == 0)) {
      uVar1 = bottom_top_blob->w;
      uVar22 = (ulong)uVar1;
      uVar14 = bottom_top_blob->h;
      uVar11 = (ulong)uVar14;
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      Mat::create(&local_f8,uVar1,sVar2,opt->workspace_allocator);
      auVar8 = _DAT_00316590;
      auVar7 = _DAT_00316580;
      auVar6 = _DAT_00316510;
      iVar19 = -100;
      if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
        uVar13 = local_f8.c * (int)local_f8.cstep;
        if (0 < (int)uVar13) {
          lVar21 = (ulong)uVar13 - 1;
          auVar25._8_4_ = (int)lVar21;
          auVar25._0_8_ = lVar21;
          auVar25._12_4_ = (int)((ulong)lVar21 >> 0x20);
          uVar16 = 0;
          auVar25 = auVar25 ^ _DAT_00316510;
          do {
            auVar28._8_4_ = (int)uVar16;
            auVar28._0_8_ = uVar16;
            auVar28._12_4_ = (int)(uVar16 >> 0x20);
            auVar31 = (auVar28 | auVar8) ^ auVar6;
            iVar12 = auVar25._4_4_;
            if ((bool)(~(auVar31._4_4_ == iVar12 && auVar25._0_4_ < auVar31._0_4_ ||
                        iVar12 < auVar31._4_4_) & 1)) {
              *(undefined4 *)((long)local_f8.data + uVar16 * 4) = 0xff7fffff;
            }
            if ((auVar31._12_4_ != auVar25._12_4_ || auVar31._8_4_ <= auVar25._8_4_) &&
                auVar31._12_4_ <= auVar25._12_4_) {
              *(undefined4 *)((long)local_f8.data + uVar16 * 4 + 4) = 0xff7fffff;
            }
            auVar31 = (auVar28 | auVar7) ^ auVar6;
            iVar19 = auVar31._4_4_;
            if (iVar19 <= iVar12 && (iVar19 != iVar12 || auVar31._0_4_ <= auVar25._0_4_)) {
              *(undefined4 *)((long)local_f8.data + uVar16 * 4 + 8) = 0xff7fffff;
              *(undefined4 *)((long)local_f8.data + uVar16 * 4 + 0xc) = 0xff7fffff;
            }
            uVar16 = uVar16 + 4;
          } while ((uVar13 + 3 & 0xfffffffc) != uVar16);
        }
        if (0 < (int)uVar14) {
          pvVar15 = bottom_top_blob->data;
          iVar12 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar16 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar18 = 0;
              do {
                fVar27 = *(float *)((long)pvVar15 + uVar18 * 4);
                fVar24 = *(float *)((long)local_f8.data + uVar18 * 4);
                if (fVar27 <= fVar24) {
                  fVar27 = fVar24;
                }
                *(float *)((long)local_f8.data + uVar18 * 4) = fVar27;
                uVar18 = uVar18 + 1;
              } while (uVar22 != uVar18);
            }
            uVar16 = uVar16 + 1;
            pvVar15 = (void *)((long)pvVar15 + (long)iVar12 * sVar3);
          } while (uVar16 != uVar11);
        }
        local_a8.cstep = 0;
        local_a8.data = (void *)0x0;
        local_a8.refcount._0_4_ = 0;
        local_a8.refcount._4_4_ = 0;
        local_a8.elemsize = 0;
        local_a8.elempack = 0;
        local_a8.allocator = (Allocator *)0x0;
        local_a8.dims = 0;
        local_a8.w = 0;
        local_a8.h = 0;
        local_a8.d = 0;
        local_a8.c = 0;
        Mat::create(&local_a8,uVar1,sVar2,opt->workspace_allocator);
        pvVar15 = local_a8.data;
        iVar19 = -100;
        if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
          if (0 < local_a8.c * (int)local_a8.cstep) {
            memset(local_a8.data,0,(ulong)(uint)(local_a8.c * (int)local_a8.cstep) << 2);
          }
          pvVar10 = local_f8.data;
          if (0 < (int)uVar14) {
            pvVar17 = bottom_top_blob->data;
            iVar12 = bottom_top_blob->w;
            sVar2 = bottom_top_blob->elemsize;
            uVar16 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar18 = 0;
                do {
                  fVar24 = expf(*(float *)((long)pvVar17 + uVar18 * 4) -
                                *(float *)((long)pvVar10 + uVar18 * 4));
                  *(float *)((long)pvVar17 + uVar18 * 4) = fVar24;
                  *(float *)((long)pvVar15 + uVar18 * 4) =
                       fVar24 + *(float *)((long)pvVar15 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar22 != uVar18);
              }
              uVar16 = uVar16 + 1;
              pvVar17 = (void *)((long)pvVar17 + (long)iVar12 * sVar2);
            } while (uVar16 != uVar11);
          }
          if (0 < (int)uVar14) {
            pvVar10 = bottom_top_blob->data;
            iVar12 = bottom_top_blob->w;
            sVar2 = bottom_top_blob->elemsize;
            uVar16 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar18 = 0;
                do {
                  *(float *)((long)pvVar10 + uVar18 * 4) =
                       *(float *)((long)pvVar10 + uVar18 * 4) /
                       *(float *)((long)pvVar15 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar22 != uVar18);
              }
              uVar16 = uVar16 + 1;
              pvVar10 = (void *)((long)pvVar10 + (long)iVar12 * sVar2);
            } while (uVar16 != uVar11);
          }
          iVar19 = 0;
        }
        piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              if (local_a8.data != (void *)0x0) {
                free(local_a8.data);
              }
            }
            else {
              (*(local_a8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar5 == (int *)0x0) {
        return iVar19;
      }
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 != 0) {
        return iVar19;
      }
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        return iVar19;
      }
    }
    else {
      if ((uVar1 == 2) && (iVar12 == 1)) {
        iVar12 = bottom_top_blob->h;
        if (0 < (long)iVar12) {
          uVar1 = bottom_top_blob->w;
          pvVar15 = bottom_top_blob->data;
          uVar22 = (ulong)uVar1;
          lVar21 = 0;
          do {
            fVar24 = -3.4028235e+38;
            if (0 < (int)uVar1) {
              uVar11 = 0;
              fVar24 = -3.4028235e+38;
              do {
                fVar27 = *(float *)((long)pvVar15 + uVar11 * 4);
                if (fVar24 <= fVar27) {
                  fVar24 = fVar27;
                }
                uVar11 = uVar11 + 1;
              } while (uVar22 != uVar11);
            }
            fVar27 = 0.0;
            if (0 < (int)uVar1) {
              uVar11 = 0;
              do {
                fVar23 = expf(*(float *)((long)pvVar15 + uVar11 * 4) - fVar24);
                *(float *)((long)pvVar15 + uVar11 * 4) = fVar23;
                fVar27 = fVar27 + fVar23;
                uVar11 = uVar11 + 1;
              } while (uVar22 != uVar11);
            }
            if (0 < (int)uVar1) {
              uVar11 = 0;
              do {
                *(float *)((long)pvVar15 + uVar11 * 4) =
                     *(float *)((long)pvVar15 + uVar11 * 4) * (1.0 / fVar27);
                uVar11 = uVar11 + 1;
              } while (uVar22 != uVar11);
            }
            lVar21 = lVar21 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar2 * (long)(int)uVar1);
          } while (lVar21 != iVar12);
        }
        goto LAB_0021b127;
      }
      if ((uVar1 == 3) && (iVar12 == 0)) {
        iVar12 = bottom_top_blob->w;
        iVar20 = bottom_top_blob->h;
        uVar1 = bottom_top_blob->c;
        uVar22 = (ulong)uVar1;
        local_f8.cstep = 0;
        local_f8.data = (void *)0x0;
        local_f8.refcount._0_4_ = 0;
        local_f8.refcount._4_4_ = 0;
        local_f8.elemsize = 0;
        local_f8.elempack = 0;
        local_f8.allocator = (Allocator *)0x0;
        local_f8.dims = 0;
        local_f8.w = 0;
        local_f8.h = 0;
        local_f8.d = 0;
        local_f8.c = 0;
        Mat::create(&local_f8,iVar12,iVar20,sVar2,opt->workspace_allocator);
        auVar8 = _DAT_00316590;
        auVar7 = _DAT_00316580;
        auVar6 = _DAT_00316510;
        iVar19 = -100;
        if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
          uVar13 = iVar20 * iVar12;
          uVar14 = local_f8.c * (int)local_f8.cstep;
          if (0 < (int)uVar14) {
            lVar21 = (ulong)uVar14 - 1;
            auVar26._8_4_ = (int)lVar21;
            auVar26._0_8_ = lVar21;
            auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
            uVar11 = 0;
            auVar26 = auVar26 ^ _DAT_00316510;
            do {
              auVar29._8_4_ = (int)uVar11;
              auVar29._0_8_ = uVar11;
              auVar29._12_4_ = (int)(uVar11 >> 0x20);
              auVar31 = (auVar29 | auVar8) ^ auVar6;
              iVar19 = auVar26._4_4_;
              if ((bool)(~(auVar31._4_4_ == iVar19 && auVar26._0_4_ < auVar31._0_4_ ||
                          iVar19 < auVar31._4_4_) & 1)) {
                *(undefined4 *)((long)local_f8.data + uVar11 * 4) = 0xff7fffff;
              }
              if ((auVar31._12_4_ != auVar26._12_4_ || auVar31._8_4_ <= auVar26._8_4_) &&
                  auVar31._12_4_ <= auVar26._12_4_) {
                *(undefined4 *)((long)local_f8.data + uVar11 * 4 + 4) = 0xff7fffff;
              }
              auVar31 = (auVar29 | auVar7) ^ auVar6;
              iVar32 = auVar31._4_4_;
              if (iVar32 <= iVar19 && (iVar32 != iVar19 || auVar31._0_4_ <= auVar26._0_4_)) {
                *(undefined4 *)((long)local_f8.data + uVar11 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_f8.data + uVar11 * 4 + 0xc) = 0xff7fffff;
              }
              uVar11 = uVar11 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar11);
          }
          uVar11 = (ulong)uVar13;
          if (0 < (int)uVar1) {
            pvVar15 = bottom_top_blob->data;
            sVar3 = bottom_top_blob->cstep;
            sVar4 = bottom_top_blob->elemsize;
            uVar16 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar18 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar15 + uVar18 * 4);
                  fVar24 = *(float *)((long)local_f8.data + uVar18 * 4);
                  if (fVar27 <= fVar24) {
                    fVar27 = fVar24;
                  }
                  *(float *)((long)local_f8.data + uVar18 * 4) = fVar27;
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              uVar16 = uVar16 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar4);
            } while (uVar16 != uVar22);
          }
          local_a8.cstep = 0;
          local_a8.data = (void *)0x0;
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.elemsize = 0;
          local_a8.elempack = 0;
          local_a8.allocator = (Allocator *)0x0;
          local_a8.dims = 0;
          local_a8.w = 0;
          local_a8.h = 0;
          local_a8.d = 0;
          local_a8.c = 0;
          Mat::create(&local_a8,iVar12,iVar20,sVar2,opt->workspace_allocator);
          iVar19 = -100;
          if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
            if (0 < local_a8.c * (int)local_a8.cstep) {
              memset(local_a8.data,0,(ulong)(uint)(local_a8.c * (int)local_a8.cstep) << 2);
            }
            pvVar10 = local_a8.data;
            pvVar15 = local_f8.data;
            if (0 < (int)uVar1) {
              pvVar17 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              uVar16 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar18 = 0;
                  do {
                    fVar24 = expf(*(float *)((long)pvVar17 + uVar18 * 4) -
                                  *(float *)((long)pvVar15 + uVar18 * 4));
                    *(float *)((long)pvVar17 + uVar18 * 4) = fVar24;
                    *(float *)((long)pvVar10 + uVar18 * 4) =
                         fVar24 + *(float *)((long)pvVar10 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar11 != uVar18);
                }
                uVar16 = uVar16 + 1;
                pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
              } while (uVar16 != uVar22);
            }
            if (0 < (int)uVar1) {
              pvVar15 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              uVar16 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar18 * 4) =
                         *(float *)((long)pvVar15 + uVar18 * 4) /
                         *(float *)((long)local_a8.data + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar11 != uVar18);
                }
                uVar16 = uVar16 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar2 * sVar3);
              } while (uVar16 != uVar22);
            }
            iVar19 = 0;
          }
          piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                if (local_a8.data != (void *)0x0) {
                  free(local_a8.data);
                }
              }
              else {
                (*(local_a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar5 == (int *)0x0) {
          return iVar19;
        }
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) {
          return iVar19;
        }
        if (local_f8.allocator != (Allocator *)0x0) {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
          return iVar19;
        }
      }
      else {
        if ((uVar1 != 3) || (iVar12 != 1)) {
          if (uVar1 != 3) {
            return 0;
          }
          if (iVar12 != 2) {
            return 0;
          }
          iVar12 = bottom_top_blob->c;
          if ((long)iVar12 < 1) {
            return 0;
          }
          uVar1 = bottom_top_blob->w;
          uVar22 = (ulong)uVar1;
          iVar19 = bottom_top_blob->h;
          local_100 = bottom_top_blob->data;
          local_58 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
          local_50 = 0;
          do {
            if (0 < iVar19) {
              iVar20 = 0;
              pvVar15 = local_100;
              do {
                fVar24 = -3.4028235e+38;
                if (0 < (int)uVar1) {
                  uVar11 = 0;
                  fVar24 = -3.4028235e+38;
                  do {
                    fVar27 = *(float *)((long)pvVar15 + uVar11 * 4);
                    if (fVar24 <= fVar27) {
                      fVar24 = fVar27;
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar22 != uVar11);
                }
                fVar27 = 0.0;
                if (0 < (int)uVar1) {
                  uVar11 = 0;
                  do {
                    fVar23 = expf(*(float *)((long)pvVar15 + uVar11 * 4) - fVar24);
                    *(float *)((long)pvVar15 + uVar11 * 4) = fVar23;
                    fVar27 = fVar27 + fVar23;
                    uVar11 = uVar11 + 1;
                  } while (uVar22 != uVar11);
                }
                if (0 < (int)uVar1) {
                  uVar11 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar11 * 4) =
                         *(float *)((long)pvVar15 + uVar11 * 4) * (1.0 / fVar27);
                    uVar11 = uVar11 + 1;
                  } while (uVar22 != uVar11);
                }
                iVar20 = iVar20 + 1;
                pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar1 * 4);
              } while (iVar20 != iVar19);
            }
            local_50 = local_50 + 1;
            local_100 = (void *)((long)local_100 + local_58);
          } while (local_50 != (long)iVar12);
          return 0;
        }
        uVar1 = bottom_top_blob->w;
        uVar11 = (ulong)uVar1;
        iVar12 = bottom_top_blob->h;
        uVar14 = bottom_top_blob->c;
        uVar22 = (ulong)uVar14;
        local_f8.cstep = 0;
        local_f8.data = (void *)0x0;
        local_f8.refcount._0_4_ = 0;
        local_f8.refcount._4_4_ = 0;
        local_f8.elemsize = 0;
        local_f8.elempack = 0;
        local_f8.allocator = (Allocator *)0x0;
        local_f8.dims = 0;
        local_f8.w = 0;
        local_f8.h = 0;
        local_f8.d = 0;
        local_f8.c = 0;
        Mat::create(&local_f8,uVar1,uVar14,sVar2,opt->workspace_allocator);
        auVar8 = _DAT_00316590;
        auVar7 = _DAT_00316580;
        auVar6 = _DAT_00316510;
        iVar19 = -100;
        if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
          lVar21 = (long)(int)uVar1;
          uVar13 = local_f8.c * (int)local_f8.cstep;
          if (0 < (int)uVar13) {
            lVar9 = (ulong)uVar13 - 1;
            auVar31._8_4_ = (int)lVar9;
            auVar31._0_8_ = lVar9;
            auVar31._12_4_ = (int)((ulong)lVar9 >> 0x20);
            uVar16 = 0;
            auVar31 = auVar31 ^ _DAT_00316510;
            do {
              auVar30._8_4_ = (int)uVar16;
              auVar30._0_8_ = uVar16;
              auVar30._12_4_ = (int)(uVar16 >> 0x20);
              auVar26 = (auVar30 | auVar8) ^ auVar6;
              iVar19 = auVar31._4_4_;
              if ((bool)(~(auVar26._4_4_ == iVar19 && auVar31._0_4_ < auVar26._0_4_ ||
                          iVar19 < auVar26._4_4_) & 1)) {
                *(undefined4 *)((long)local_f8.data + uVar16 * 4) = 0xff7fffff;
              }
              if ((auVar26._12_4_ != auVar31._12_4_ || auVar26._8_4_ <= auVar31._8_4_) &&
                  auVar26._12_4_ <= auVar31._12_4_) {
                *(undefined4 *)((long)local_f8.data + uVar16 * 4 + 4) = 0xff7fffff;
              }
              auVar30 = (auVar30 | auVar7) ^ auVar6;
              iVar20 = auVar30._4_4_;
              if (iVar20 <= iVar19 && (iVar20 != iVar19 || auVar30._0_4_ <= auVar31._0_4_)) {
                *(undefined4 *)((long)local_f8.data + uVar16 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_f8.data + uVar16 * 4 + 0xc) = 0xff7fffff;
              }
              uVar16 = uVar16 + 4;
            } while ((uVar13 + 3 & 0xfffffffc) != uVar16);
          }
          if (0 < (int)uVar14) {
            pvVar15 = bottom_top_blob->data;
            sVar3 = bottom_top_blob->cstep;
            sVar4 = bottom_top_blob->elemsize;
            uVar16 = 0;
            pvVar10 = local_f8.data;
            do {
              if (0 < iVar12) {
                iVar19 = 0;
                pvVar17 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    uVar18 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar17 + uVar18 * 4);
                      fVar24 = *(float *)((long)pvVar10 + uVar18 * 4);
                      if (fVar27 <= fVar24) {
                        fVar27 = fVar24;
                      }
                      *(float *)((long)pvVar10 + uVar18 * 4) = fVar27;
                      uVar18 = uVar18 + 1;
                    } while (uVar11 != uVar18);
                  }
                  iVar19 = iVar19 + 1;
                  pvVar17 = (void *)((long)pvVar17 + lVar21 * 4);
                } while (iVar19 != iVar12);
              }
              uVar16 = uVar16 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar4);
              pvVar10 = (void *)((long)pvVar10 + (long)local_f8.w * local_f8.elemsize);
            } while (uVar16 != uVar22);
          }
          local_a8.cstep = 0;
          local_a8.data = (void *)0x0;
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.elemsize = 0;
          local_a8.elempack = 0;
          local_a8.allocator = (Allocator *)0x0;
          local_a8.dims = 0;
          local_a8.w = 0;
          local_a8.h = 0;
          local_a8.d = 0;
          local_a8.c = 0;
          Mat::create(&local_a8,uVar1,uVar14,sVar2,opt->workspace_allocator);
          iVar19 = -100;
          if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
            if (0 < local_a8.c * (int)local_a8.cstep) {
              memset(local_a8.data,0,(ulong)(uint)(local_a8.c * (int)local_a8.cstep) << 2);
            }
            if (0 < (int)uVar14) {
              local_100 = bottom_top_blob->data;
              local_38 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
              local_48 = (long)local_a8.w * local_a8.elemsize;
              local_40 = (long)local_f8.w * local_f8.elemsize;
              uVar16 = 0;
              pvVar15 = local_a8.data;
              pvVar10 = local_f8.data;
              local_58 = uVar22;
              do {
                local_50 = uVar16;
                if (0 < iVar12) {
                  iVar19 = 0;
                  pvVar17 = local_100;
                  do {
                    if (0 < (int)uVar1) {
                      uVar22 = 0;
                      do {
                        fVar24 = expf(*(float *)((long)pvVar17 + uVar22 * 4) -
                                      *(float *)((long)pvVar10 + uVar22 * 4));
                        *(float *)((long)pvVar17 + uVar22 * 4) = fVar24;
                        *(float *)((long)pvVar15 + uVar22 * 4) =
                             fVar24 + *(float *)((long)pvVar15 + uVar22 * 4);
                        uVar22 = uVar22 + 1;
                      } while (uVar11 != uVar22);
                    }
                    iVar19 = iVar19 + 1;
                    pvVar17 = (void *)((long)pvVar17 + lVar21 * 4);
                  } while (iVar19 != iVar12);
                }
                uVar16 = local_50 + 1;
                pvVar15 = (void *)((long)pvVar15 + local_48);
                pvVar10 = (void *)((long)pvVar10 + local_40);
                local_100 = (void *)((long)local_100 + local_38);
                uVar22 = local_58;
              } while (uVar16 != local_58);
            }
            if (0 < (int)uVar22) {
              pvVar15 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              uVar16 = 0;
              pvVar10 = local_a8.data;
              do {
                if (0 < iVar12) {
                  iVar19 = 0;
                  pvVar17 = pvVar15;
                  do {
                    if (0 < (int)uVar1) {
                      uVar18 = 0;
                      do {
                        *(float *)((long)pvVar17 + uVar18 * 4) =
                             *(float *)((long)pvVar17 + uVar18 * 4) /
                             *(float *)((long)pvVar10 + uVar18 * 4);
                        uVar18 = uVar18 + 1;
                      } while (uVar11 != uVar18);
                    }
                    iVar19 = iVar19 + 1;
                    pvVar17 = (void *)((long)pvVar17 + lVar21 * 4);
                  } while (iVar19 != iVar12);
                }
                uVar16 = uVar16 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar2 * sVar3);
                pvVar10 = (void *)((long)pvVar10 + (long)local_a8.w * local_a8.elemsize);
              } while (uVar16 != uVar22);
            }
            iVar19 = 0;
          }
          Mat::~Mat(&local_a8);
        }
        piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar5 == (int *)0x0) {
          return iVar19;
        }
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) {
          return iVar19;
        }
        if (local_f8.allocator != (Allocator *)0x0) {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
          return iVar19;
        }
      }
    }
    if (local_f8.data != (void *)0x0) {
      free(local_f8.data);
    }
  }
  return iVar19;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = static_cast<float>(exp(ptr[i] - max));
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - max[j]));
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - m));
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(exp(ptr[i] - max[i]));
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - maxptr[j]));
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}